

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::keyboardSearch(QTreeView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  QTreeViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  PrivateShared *pPVar2;
  int arow;
  undefined8 uVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *puVar10;
  QTreeViewItem *pQVar11;
  long lVar12;
  int i;
  ulong uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint local_f0;
  undefined8 local_d8;
  QModelIndex *pQStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  PrivateShared *local_b8;
  QModelIndex *pQStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  QArrayDataPointer<char16_t> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
  if (iVar6 != 0) {
    pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
    iVar6 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QModelIndex *)&local_78);
    if ((iVar6 != 0) &&
       (QAbstractItemViewPrivate::executePostedLayout(&this_01->super_QAbstractItemViewPrivate),
       (this_01->viewItems).d.size != 0)) {
      QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
      if (((int)local_58._0_4_ < 0) ||
         (((long)local_58.shared < 0 ||
          ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)))) {
        pQVar11 = (this_01->viewItems).d.ptr;
        local_68.ptr = (pQVar11->index).m.ptr;
        uVar17 = (pQVar11->index).r;
        uVar18 = (pQVar11->index).c;
        uVar19 = (undefined4)(pQVar11->index).i;
        uVar20 = *(undefined4 *)((long)&(pQVar11->index).i + 4);
      }
      else {
        QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
        local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
        uVar17 = local_58._0_4_;
        uVar18 = local_58._4_4_;
        uVar19 = local_58._8_4_;
        uVar20 = local_58._12_4_;
      }
      local_78 = (PrivateShared *)CONCAT44(uVar18,uVar17);
      uStack_70 = (QModelIndex *)CONCAT44(uVar20,uVar19);
      cVar5 = QElapsedTimer::isValid();
      if (cVar5 == '\0') {
        puVar10 = &DAT_aaaaaaaaaaaaaaaa;
        QElapsedTimer::start();
      }
      else {
        puVar10 = (undefined1 *)QElapsedTimer::restart();
      }
      if ((cVar5 == '\x01' && (search->d).size != 0) &&
         (iVar6 = QApplication::keyboardInputInterval(), (long)puVar10 <= (long)iVar6)) {
        QString::append((QString *)&(this_01->super_QAbstractItemViewPrivate).keyboardInput);
        bVar15 = false;
      }
      else {
        QString::operator=(&(this_01->super_QAbstractItemViewPrivate).keyboardInput,
                           (QString *)search);
        QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
        bVar15 = false;
        if ((-1 < (int)local_58._0_4_) && (bVar15 = false, -1 < (long)local_58.shared)) {
          bVar15 = (QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0;
        }
      }
      uVar13 = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
      if (uVar13 < 2) {
        bVar16 = false;
      }
      else {
        iVar6 = QString::count((QChar)((short)this_01 + L'ϰ'),
                               (uint)(ushort)(this_01->super_QAbstractItemViewPrivate).keyboardInput
                                             .d.ptr[uVar13 - 1]);
        bVar16 = (long)iVar6 == (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
        bVar15 = (bool)(bVar15 | bVar16);
      }
      if (bVar15) {
        indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
        if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
           ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
          iVar6 = local_78._4_4_;
          pQVar11 = (this_01->viewItems).d.ptr;
          pPVar2 = *(PrivateShared **)&pQVar11->index;
          uStack_70 = (QModelIndex *)(pQVar11->index).i;
          local_68.ptr = (pQVar11->index).m.ptr;
          local_78._4_4_ = (int)((ulong)pPVar2 >> 0x20);
          bVar15 = iVar6 != local_78._4_4_;
          local_78 = pPVar2;
          if (bVar15) {
            local_78._0_4_ = (int)pPVar2;
            arow = (int)local_78;
            QModelIndex::sibling((QModelIndex *)&local_58,(QModelIndex *)&local_78,arow,iVar6);
            local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
            local_78 = local_58.shared;
            uStack_70 = (QModelIndex *)local_58._8_8_;
          }
        }
        else {
          indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
          local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
          local_78 = local_58.shared;
          uStack_70 = (QModelIndex *)local_58._8_8_;
        }
      }
      uVar7 = QTreeViewPrivate::viewIndex(this_01,(QModelIndex *)&local_78);
      if (-1 < (int)uVar7) {
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        if (bVar16) {
          QString::QString((QString *)&local_98,
                           (QChar)*(this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr);
        }
        else {
          local_98.d = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.d;
          local_98.ptr = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr;
          local_98.size = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        uVar9 = 0xffffffff;
        lVar12 = 0x1c;
        uVar13 = 0;
        local_f0 = 0xffffffff;
        uVar14 = 0xffffffff;
        while( true ) {
          if ((ulong)(this_01->viewItems).d.size <= uVar13) break;
          pQVar11 = (this_01->viewItems).d.ptr;
          if ((int)uVar9 < (int)(uint)*(ushort *)((long)&(pQVar11->index).c + lVar12)) {
            local_b8 = *(PrivateShared **)((long)pQVar11 + lVar12 + -0x1c);
            pQStack_b0 = *(QModelIndex **)((long)pQVar11 + lVar12 + -0x14);
            local_a8.ptr = *(QAbstractItemModel **)((long)pQVar11 + lVar12 + -0xc);
            if (0 < local_78._4_4_) {
              QModelIndex::sibling
                        ((QModelIndex *)&local_58,(QModelIndex *)&local_b8,(int)local_b8,
                         local_78._4_4_);
              local_a8.ptr = (QAbstractItemModel *)local_58._16_8_;
              local_b8 = local_58.shared;
              pQStack_b0 = (QModelIndex *)local_58._8_8_;
            }
            QModelIndex::parent((QModelIndex *)&local_58,(QModelIndex *)&local_b8);
            QModelIndex::parent((QModelIndex *)&local_d8,(QModelIndex *)&local_78);
            if (local_58._0_4_ == (int)local_d8) {
              if (((local_58._4_4_ == local_d8._4_4_) &&
                  ((QModelIndex *)local_58._8_8_ == pQStack_d0)) &&
                 ((QAbstractItemModel *)local_58._16_8_ == local_c8.ptr)) {
                local_a8.ptr = local_68.ptr;
                local_b8 = local_78;
                pQStack_b0 = uStack_70;
              }
            }
            local_c8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_d8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_d0 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
            ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_98);
            (**(code **)(*(long *)pQVar1 + 0x150))(&local_d8,pQVar1,&local_b8,0,&local_58,1,0x22);
            ::QVariant::~QVariant((QVariant *)&local_58);
            uVar9 = local_f0;
            uVar4 = uVar14;
            if (local_c8.ptr != (QAbstractItemModel *)0x0) {
              uVar8 = QTreeViewPrivate::viewIndex(this_01,pQStack_d0);
              if (uVar8 < uVar7) {
                uVar4 = uVar8;
                if ((uVar14 != 0xffffffff) && (uVar4 = uVar14, (int)uVar8 < (int)uVar14)) {
                  uVar4 = uVar8;
                }
              }
              else if ((((int)uVar7 <= (int)uVar8) && (uVar9 = uVar8, local_f0 != 0xffffffff)) &&
                      (uVar9 = local_f0, (int)uVar8 < (int)local_f0)) {
                uVar9 = uVar8;
              }
            }
            uVar14 = uVar4;
            local_f0 = uVar9;
            QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                      ((QArrayDataPointer<QModelIndex> *)&local_d8);
            pQVar11 = (this_01->viewItems).d.ptr;
          }
          uVar9 = (uint)*(ushort *)((long)&(pQVar11->index).c + lVar12);
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x28;
        }
        local_58._forAlignment = -NAN;
        local_58._8_8_ = (QModelIndex *)0x0;
        local_58._16_8_ = (QAbstractItemModel *)0x0;
        if ((-1 < (int)local_f0) || (local_f0 = uVar14, -1 < (int)uVar14)) {
          pQVar11 = (this_01->viewItems).d.ptr;
          local_58._16_8_ = pQVar11[local_f0].index.m.ptr;
          pQVar11 = pQVar11 + local_f0;
          local_58.shared = (PrivateShared *)*(undefined8 *)&pQVar11->index;
          local_58._8_8_ = (pQVar11->index).i;
        }
        uVar17 = local_58._0_4_;
        uVar3 = local_58._forAlignment;
        if (0 < local_78._4_4_) {
          QModelIndex::sibling
                    ((QModelIndex *)&local_b8,(QModelIndex *)&local_58,local_58._0_4_,local_78._4_4_
                    );
          local_58._16_8_ = local_a8.ptr;
          local_58.shared = local_b8;
          uVar3 = local_58.shared;
          local_58._8_8_ = pQStack_b0;
          local_58._0_4_ = SUB84(local_b8,0);
          uVar17 = local_58._0_4_;
        }
        local_58._forAlignment = (double)uVar3;
        if (((-1 < (int)uVar17) && (-1 < (long)local_58.shared)) &&
           ((QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0)) {
          QAbstractItemView::setCurrentIndex((QAbstractItemView *)this,(QModelIndex *)&local_58);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::keyboardSearch(const QString &search)
{
    Q_D(QTreeView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    // Do a relayout nows, so that we can utilize viewItems
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return;

    QModelIndex start;
    if (currentIndex().isValid())
        start = currentIndex();
    else
        start = d->viewItems.at(0).index;

    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        if (indexBelow(start).isValid()) {
            start = indexBelow(start);
        } else {
            const int origCol = start.column();
            start = d->viewItems.at(0).index;
            if (origCol != start.column())
                start = start.sibling(start.row(), origCol);
        }
    }

    int startIndex = d->viewIndex(start);
    if (startIndex <= -1)
        return;

    int previousLevel = -1;
    int bestAbove = -1;
    int bestBelow = -1;
    QString searchString = sameKey ? QString(d->keyboardInput.at(0)) : d->keyboardInput;
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if ((int)d->viewItems.at(i).level > previousLevel) {
            QModelIndex searchFrom = d->viewItems.at(i).index;
            if (start.column() > 0)
                searchFrom = searchFrom.sibling(searchFrom.row(), start.column());
            if (searchFrom.parent() == start.parent())
                searchFrom = start;
            QModelIndexList match = d->model->match(searchFrom, Qt::DisplayRole, searchString);
            if (match.size()) {
                int hitIndex = d->viewIndex(match.at(0));
                if (hitIndex >= 0 && hitIndex < startIndex)
                    bestAbove = bestAbove == -1 ? hitIndex : qMin(hitIndex, bestAbove);
                else if (hitIndex >= startIndex)
                    bestBelow = bestBelow == -1 ? hitIndex : qMin(hitIndex, bestBelow);
            }
        }
        previousLevel = d->viewItems.at(i).level;
    }

    QModelIndex index;
    if (bestBelow > -1)
        index = d->viewItems.at(bestBelow).index;
    else if (bestAbove > -1)
        index = d->viewItems.at(bestAbove).index;

    if (start.column() > 0)
        index = index.sibling(index.row(), start.column());

    if (index.isValid())
        setCurrentIndex(index);
}